

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.cpp
# Opt level: O2

bool __thiscall
duckdb::ART::SearchLess
          (ART *this,ARTKey *upper_bound,bool equal,idx_t max_count,unsafe_vector<row_t> *row_ids)

{
  bool bVar1;
  bool bVar2;
  Iterator it;
  Iterator IStack_b8;
  
  bVar2 = true;
  if (*(char *)((long)&(this->tree).super_IndexPointer.data + 7) != '\0') {
    Iterator::Iterator(&IStack_b8,this);
    Iterator::FindMinimum(&IStack_b8,&this->tree);
    bVar1 = IteratorKey::GreaterThan
                      (&IStack_b8.current_key,upper_bound,equal,IStack_b8.nested_depth);
    bVar2 = true;
    if (!bVar1) {
      bVar2 = Iterator::Scan(&IStack_b8,upper_bound,max_count,row_ids,equal);
    }
    Iterator::~Iterator(&IStack_b8);
  }
  return bVar2;
}

Assistant:

bool ART::SearchLess(ARTKey &upper_bound, bool equal, idx_t max_count, unsafe_vector<row_t> &row_ids) {
	if (!tree.HasMetadata()) {
		return true;
	}

	// Find the minimum value in the ART: we start scanning from this value.
	Iterator it(*this);
	it.FindMinimum(tree);

	// Early-out, if the minimum value is higher than the upper bound.
	if (it.current_key.GreaterThan(upper_bound, equal, it.GetNestedDepth())) {
		return true;
	}

	// Continue the scan until we reach the upper bound.
	return it.Scan(upper_bound, max_count, row_ids, equal);
}